

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RS232Port.h
# Opt level: O0

int PurgeRS232Port(RS232PORT *pRS232Port)

{
  RS232PORT *pRS232Port_local;
  
  if (pRS232Port->DevType == 0) {
    pRS232Port_local._4_4_ = PurgeComputerRS232Port(pRS232Port->hDev);
  }
  else if (pRS232Port->DevType - 1U < 4) {
    pRS232Port_local._4_4_ = flushsocket(pRS232Port->s);
  }
  else {
    pRS232Port_local._4_4_ = 1;
  }
  return pRS232Port_local._4_4_;
}

Assistant:

inline int PurgeRS232Port(RS232PORT* pRS232Port)
{
	switch (pRS232Port->DevType)
	{
	case TCP_CLIENT_TYPE_RS232PORT:
	case TCP_SERVER_TYPE_RS232PORT:
	case UDP_CLIENT_TYPE_RS232PORT:
	case UDP_SERVER_TYPE_RS232PORT:
		return flushsocket(pRS232Port->s);
	case LOCAL_TYPE_RS232PORT:
		return PurgeComputerRS232Port(pRS232Port->hDev);
	default:
		PRINT_DEBUG_ERROR_RS232PORT(("PurgeRS232Port error (%s) : %s(pRS232Port=%#x)\n", 
			strtime_m(), 
			"Invalid device type. ", 
			pRS232Port));
		return EXIT_FAILURE;
	}
}